

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O3

void __thiscall cppcms::form::~form(form *this)

{
  base_form *pbVar1;
  _data *p_Var2;
  bool bVar3;
  ulong uVar4;
  pointer ppVar5;
  ulong uVar6;
  pointer ppVar7;
  
  (this->super_base_form)._vptr_base_form = (_func_int **)&PTR_render_00286778;
  ppVar7 = (this->elements_).
           super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->elements_).
           super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar7) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      if ((ppVar7[uVar4].second == true) &&
         (pbVar1 = ppVar7[uVar4].first, pbVar1 != (base_form *)0x0)) {
        (*pbVar1->_vptr_base_form[7])(pbVar1);
        ppVar7 = (this->elements_).
                 super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppVar5 = (this->elements_).
                 super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      bVar3 = uVar6 < (ulong)((long)ppVar5 - (long)ppVar7 >> 4);
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar3);
  }
  p_Var2 = (this->d).ptr_;
  if (p_Var2 != (_data *)0x0) {
    operator_delete(p_Var2);
    ppVar7 = (this->elements_).
             super__Vector_base<std::pair<cppcms::base_form_*,_bool>,_std::allocator<std::pair<cppcms::base_form_*,_bool>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppVar7 != (pointer)0x0) {
    operator_delete(ppVar7);
    return;
  }
  return;
}

Assistant:

form::~form()
{
	for(unsigned i=0;i<elements_.size();i++) {
		if(elements_[i].second)
			delete elements_[i].first;
	}
}